

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

int __thiscall CharFieldSourceString::arraylen(CharFieldSourceString *this,CVmPackType *t)

{
  wchar_t wVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  char *end;
  byte *pbVar7;
  
  wVar1 = t->type_code;
  if (wVar1 < L'a') {
    if (L'T' < wVar1) {
      if (wVar1 == L'U') goto LAB_00278177;
      if (wVar1 != L'W') {
        return 0;
      }
      goto LAB_00278136;
    }
    if (wVar1 == L'A') goto LAB_002780dc;
    if (wVar1 != L'H') {
      return 0;
    }
  }
  else {
    if (L't' < wVar1) {
      if (wVar1 == L'u') {
LAB_00278177:
        return (int)this->len;
      }
      if (wVar1 != L'w') {
        return 0;
      }
LAB_00278136:
      if ((long)this->len < 1) {
        iVar4 = 0;
      }
      else {
        pbVar7 = (byte *)(this->p).p_;
        pbVar6 = pbVar7 + this->len;
        iVar4 = 0;
        do {
          pbVar7 = pbVar7 + (ulong)(((*pbVar7 >> 5 & 1) != 0) + 1 & (uint)(*pbVar7 >> 7) * 3) + 1;
          iVar4 = iVar4 + 1;
        } while (pbVar7 < pbVar6);
      }
      return iVar4 << (t->count_in_bytes != 0);
    }
    if ((uint)(wVar1 + L'\xffffff9f') < 2) {
LAB_002780dc:
      if ((long)this->len < 1) {
        return 0;
      }
      pbVar7 = (byte *)(this->p).p_;
      pbVar6 = pbVar7 + this->len;
      iVar4 = 0;
      do {
        pbVar7 = pbVar7 + (ulong)(((*pbVar7 >> 5 & 1) != 0) + 1 & (uint)(*pbVar7 >> 7) * 3) + 1;
        iVar4 = iVar4 + 1;
      } while (pbVar7 < pbVar6);
      return iVar4;
    }
    if (wVar1 != L'h') {
      return 0;
    }
  }
  pbVar6 = (byte *)(this->p).p_;
  sVar2 = this->len;
  pbVar7 = pbVar6 + sVar2;
  if (t->count_in_bytes == 0) {
    iVar3 = 0;
    iVar4 = 0;
    if (0 < (long)sVar2) {
      do {
        pbVar6 = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
        iVar3 = iVar4 + 1;
        iVar4 = iVar3;
      } while (pbVar6 < pbVar7);
    }
  }
  else {
    iVar3 = 0;
    if (0 < (long)sVar2) {
      uVar5 = 1;
      do {
        pbVar6 = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
        uVar5 = uVar5 + 1;
      } while (pbVar6 < pbVar7);
      return (int)(uVar5 >> 1);
    }
  }
  return iVar3;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* the length is in bytes, and we write one byte per character */
            return p.len(len);

        case 'w':
        case 'W':
            /* 
             *   the default length is in characters; if counting in bytes,
             *   we need two bytes per character 
             */
            return (t->count_in_bytes ? 2 : 1) * p.len(len);
            
        case 'h':
        case 'H':
            /* 
             *   the length is in source nibbles, one nibble per character;
             *   in bytes, we need half as many bytes as characters, rounded
             *   up 
             */
            return t->count_in_bytes ? (p.len(len)+1)/2 : p.len(len);

        case 'u':
        case 'U':
            /* 
             *   the length is in bytes, in UTF-8 format; this is the same
             *   format as our underlying string, so we can simply return its
             *   byte length 
             */
            return len;

        default:
            return 0;
        }
    }